

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O3

void brotli::HistogramCombine<brotli::Histogram<256>>
               (Histogram<256> *out,uint32_t *cluster_size,uint32_t *symbols,size_t symbols_size,
               size_t max_clusters)

{
  undefined8 *puVar1;
  pointer pHVar2;
  double *pdVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined8 uVar8;
  pointer puVar9;
  size_t sVar10;
  ulong uVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  size_t __n;
  pointer puVar16;
  size_t sVar17;
  size_type __new_size;
  uint *puVar18;
  size_t i;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint32_t *puVar22;
  ulong uVar23;
  vector<unsigned_int,_std::allocator<unsigned_int>_> clusters;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> pairs;
  HistogramPair front;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> local_88;
  uint32_t *local_70;
  ulong local_68;
  double local_60;
  size_t local_58;
  size_t local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  local_70 = symbols;
  local_58 = max_clusters;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_a0,symbols,
             symbols + symbols_size,(allocator_type *)&local_88);
  puVar9 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar16 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar11 = (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    lVar19 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar16,puVar9);
    puVar16 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar13 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
      do {
        puVar18 = puVar13;
        if (puVar18 ==
            local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_00170908;
        puVar13 = puVar18 + 1;
      } while (puVar18[-1] != *puVar18);
      puVar12 = puVar18 + -1;
      uVar14 = puVar18[-1];
      for (; puVar13 !=
             local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish; puVar13 = puVar13 + 1) {
        uVar5 = *puVar13;
        if (uVar14 != uVar5) {
          puVar12[1] = uVar5;
          puVar12 = puVar12 + 1;
        }
        uVar14 = uVar5;
      }
      puVar16 = puVar12 + 1;
    }
  }
LAB_00170908:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_a0,
             (long)puVar16 -
             (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar13 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar18 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar22 = local_70;
  local_50 = symbols_size;
  if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = 0;
  }
  else {
    uVar21 = 0;
    do {
      uVar23 = uVar21 + 1;
      uVar11 = (long)puVar13 - (long)puVar18;
      uVar15 = (long)uVar11 >> 2;
      uVar20 = uVar23;
      if (uVar23 < uVar15) {
        do {
          CompareAndPushToQueue<brotli::Histogram<256>>
                    (out,cluster_size,puVar18[uVar21],puVar18[uVar20],&local_88);
          uVar20 = uVar20 + 1;
          uVar11 = (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          uVar15 = (long)uVar11 >> 2;
          puVar13 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish;
          puVar18 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          puVar22 = local_70;
        } while (uVar20 < uVar15);
      }
      uVar21 = uVar23;
    } while (uVar23 < uVar15);
  }
  sVar10 = local_50;
  if (4 < uVar11) {
    local_68 = 1;
    local_60 = 0.0;
    do {
      while (local_60 <=
             (local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start)->cost_diff) {
        local_60 = 1e+99;
        local_68 = local_58;
        if ((ulong)((long)puVar13 - (long)puVar18 >> 2) <= local_58) goto LAB_00170c42;
      }
      uVar14 = (local_88.
                super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
                _M_impl.super__Vector_impl_data._M_start)->idx1;
      uVar5 = (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->idx2;
      out[uVar14].total_count_ = out[uVar14].total_count_ + out[uVar5].total_count_;
      lVar19 = 0;
      do {
        out[uVar14].data_[lVar19] = out[uVar14].data_[lVar19] + out[uVar5].data_[lVar19];
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x100);
      out[uVar14].bit_cost_ =
           (local_88.
            super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
            _M_impl.super__Vector_impl_data._M_start)->cost_combo;
      cluster_size[uVar14] = cluster_size[uVar14] + cluster_size[uVar5];
      if (sVar10 != 0) {
        sVar17 = 0;
        do {
          if (puVar22[sVar17] == uVar5) {
            puVar22[sVar17] = uVar14;
          }
          sVar17 = sVar17 + 1;
        } while (sVar10 != sVar17);
      }
      if (puVar18 != puVar13) {
        __n = (long)puVar13 - (long)puVar18;
        do {
          __n = __n - 4;
          if (uVar5 <= *puVar18) {
            if (puVar18 + 1 != puVar13) {
              memmove(puVar18,puVar18 + 1,__n);
              puVar13 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar13 + -1;
            break;
          }
          puVar18 = puVar18 + 1;
        } while (puVar18 != puVar13);
      }
      if (local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __new_size = 0;
      }
      else {
        lVar19 = 0;
        uVar11 = 0;
        __new_size = 0;
        do {
          uVar6 = *(uint *)((long)&(local_88.
                                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->idx1 + lVar19);
          if ((((uVar6 != uVar14) &&
               (uVar7 = *(uint *)((long)&(local_88.
                                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->idx2 + lVar19)
               , uVar7 != uVar5)) && (uVar6 != uVar5)) && (uVar7 != uVar14)) {
            puVar1 = (undefined8 *)
                     ((long)&(local_88.
                              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                              ._M_impl.super__Vector_impl_data._M_start)->idx1 + lVar19);
            dVar4 = (local_88.
                     super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                     ._M_impl.super__Vector_impl_data._M_start)->cost_diff;
            pdVar3 = (double *)
                     ((long)&(local_88.
                              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                              ._M_impl.super__Vector_impl_data._M_start)->cost_diff + lVar19);
            if ((dVar4 != *pdVar3) || (NAN(dVar4) || NAN(*pdVar3))) {
              if (dVar4 < *pdVar3 || dVar4 == *pdVar3) goto LAB_00170b54;
LAB_00170b06:
              local_38 = (local_88.
                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                          ._M_impl.super__Vector_impl_data._M_start)->cost_diff;
              local_48._0_4_ =
                   (local_88.
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    ._M_impl.super__Vector_impl_data._M_start)->idx1;
              local_48._4_4_ =
                   (local_88.
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    ._M_impl.super__Vector_impl_data._M_start)->idx2;
              dStack_40 = (local_88.
                           super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                           ._M_impl.super__Vector_impl_data._M_start)->cost_combo;
              uVar8 = *puVar1;
              dVar4 = (double)puVar1[1];
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->idx1 = (int)uVar8;
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->idx2 = (int)((ulong)uVar8 >> 0x20);
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->cost_combo = dVar4;
              (local_88.
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
               _M_impl.super__Vector_impl_data._M_start)->cost_diff = (double)puVar1[2];
              local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start[__new_size].cost_diff = local_38;
              pHVar2 = local_88.
                       super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                       ._M_impl.super__Vector_impl_data._M_start + __new_size;
              pHVar2->idx1 = (undefined4)local_48;
              pHVar2->idx2 = local_48._4_4_;
              pHVar2->cost_combo = dStack_40;
            }
            else {
              if (uVar7 - uVar6 <
                  (local_88.
                   super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->idx2 -
                  (local_88.
                   super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                   ._M_impl.super__Vector_impl_data._M_start)->idx1) goto LAB_00170b06;
LAB_00170b54:
              local_88.
              super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
              _M_impl.super__Vector_impl_data._M_start[__new_size].cost_diff = (double)puVar1[2];
              uVar8 = *puVar1;
              dVar4 = (double)puVar1[1];
              pHVar2 = local_88.
                       super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                       ._M_impl.super__Vector_impl_data._M_start + __new_size;
              pHVar2->idx1 = (int)uVar8;
              pHVar2->idx2 = (int)((ulong)uVar8 >> 0x20);
              pHVar2->cost_combo = dVar4;
            }
            __new_size = __new_size + 1;
          }
          uVar11 = uVar11 + 1;
          lVar19 = lVar19 + 0x18;
        } while (uVar11 < (ulong)(((long)local_88.
                                         super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.
                                         super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::resize
                (&local_88,__new_size);
      if (local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar11 = 0;
      }
      else {
        uVar21 = 0;
        do {
          CompareAndPushToQueue<brotli::Histogram<256>>
                    (out,cluster_size,uVar14,
                     local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar21],&local_88);
          uVar21 = uVar21 + 1;
          uVar11 = (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2;
          puVar22 = local_70;
        } while (uVar21 < uVar11);
      }
      puVar13 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      puVar18 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_68 < uVar11);
  }
LAB_00170c42:
  if (local_88.super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    puVar18 = local_a0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (puVar18 != (uint *)0x0) {
    operator_delete(puVar18,(long)local_a0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar18)
    ;
  }
  return;
}

Assistant:

void HistogramCombine(HistogramType* out,
                      uint32_t* cluster_size,
                      uint32_t* symbols,
                      size_t symbols_size,
                      size_t max_clusters) {
  double cost_diff_threshold = 0.0;
  size_t min_cluster_size = 1;

  // Uniquify the list of symbols.
  std::vector<uint32_t> clusters(symbols, symbols + symbols_size);
  std::sort(clusters.begin(), clusters.end());
  std::vector<uint32_t>::iterator last =
      std::unique(clusters.begin(), clusters.end());
  clusters.resize(static_cast<size_t>(last - clusters.begin()));

  // We maintain a heap of histogram pairs, ordered by the bit cost reduction.
  std::vector<HistogramPair> pairs;
  for (size_t idx1 = 0; idx1 < clusters.size(); ++idx1) {
    for (size_t idx2 = idx1 + 1; idx2 < clusters.size(); ++idx2) {
      CompareAndPushToQueue(out, cluster_size, clusters[idx1], clusters[idx2],
                            &pairs);
    }
  }

  while (clusters.size() > min_cluster_size) {
    if (pairs[0].cost_diff >= cost_diff_threshold) {
      cost_diff_threshold = 1e99;
      min_cluster_size = max_clusters;
      continue;
    }
    // Take the best pair from the top of heap.
    uint32_t best_idx1 = pairs[0].idx1;
    uint32_t best_idx2 = pairs[0].idx2;
    out[best_idx1].AddHistogram(out[best_idx2]);
    out[best_idx1].bit_cost_ = pairs[0].cost_combo;
    cluster_size[best_idx1] += cluster_size[best_idx2];
    for (size_t i = 0; i < symbols_size; ++i) {
      if (symbols[i] == best_idx2) {
        symbols[i] = best_idx1;
      }
    }
    for (std::vector<uint32_t>::iterator cluster = clusters.begin();
         cluster != clusters.end(); ++cluster) {
      if (*cluster >= best_idx2) {
        clusters.erase(cluster);
        break;
      }
    }

    // Remove pairs intersecting the just combined best pair.
    size_t copy_to_idx = 0;
    for (size_t i = 0; i < pairs.size(); ++i) {
      HistogramPair& p = pairs[i];
      if (p.idx1 == best_idx1 || p.idx2 == best_idx1 ||
          p.idx1 == best_idx2 || p.idx2 == best_idx2) {
        // Remove invalid pair from the queue.
        continue;
      }
      if (pairs.front() < p) {
        // Replace the top of the queue if needed.
        HistogramPair front = pairs.front();
        pairs.front() = p;
        pairs[copy_to_idx] = front;
      } else {
        pairs[copy_to_idx] = p;
      }
      ++copy_to_idx;
    }
    pairs.resize(copy_to_idx);

    // Push new pairs formed with the combined histogram to the heap.
    for (size_t i = 0; i < clusters.size(); ++i) {
      CompareAndPushToQueue(out, cluster_size, best_idx1, clusters[i], &pairs);
    }
  }
}